

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Token * __thiscall JSON::Parser::readNumberToken(Token *__return_storage_ptr__,Parser *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  size_type sVar8;
  bool bVar9;
  ulong uVar10;
  undefined8 extraout_RAX;
  uint uVar11;
  byte bVar12;
  int iVar13;
  byte bVar14;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  string value;
  
  uVar5 = this->pos;
  psVar1 = &this->input;
  if ((this->input)._M_dataplus._M_p[(int)uVar5] != '-') {
    bVar14 = 0;
    bVar7 = true;
    uVar10 = (ulong)uVar5;
    bVar12 = 0;
    iVar13 = 0;
    goto LAB_001047e1;
  }
  uVar10 = (ulong)(uVar5 + 1);
  bVar14 = 0;
  bVar7 = true;
  bVar12 = 0;
  iVar13 = 0;
LAB_001047da:
  this->pos = (int)uVar10;
LAB_001047e1:
  do {
    iVar13 = iVar13 + 1;
    if (this->length <= (int)uVar10) {
      if (!bVar7) {
LAB_00104875:
        std::__cxx11::string::substr((ulong)&value,(ulong)psVar1);
        std::__cxx11::string::string((string *)&local_70,(string *)&value);
        sVar8 = local_68;
        iVar13 = this->pos;
        __return_storage_ptr__->type = NUMBER;
        paVar2 = &(__return_storage_ptr__->value).field_2;
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar2;
        if (local_70 == &local_60) {
          paVar2->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
          *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_58;
        }
        else {
          (__return_storage_ptr__->value)._M_dataplus._M_p = local_70;
          (__return_storage_ptr__->value).field_2._M_allocated_capacity =
               CONCAT71(uStack_5f,local_60);
        }
        local_68 = 0;
        (__return_storage_ptr__->value)._M_string_length = sVar8;
        local_60 = '\0';
        __return_storage_ptr__->start = uVar5;
        __return_storage_ptr__->end = iVar13;
        local_70 = &local_60;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&value);
        return __return_storage_ptr__;
      }
LAB_00104969:
      unexpected(this,TYPE_NUMBER,this->pos);
      std::__cxx11::string::~string((string *)&value);
      _Unwind_Resume(extraout_RAX);
    }
    bVar3 = (psVar1->_M_dataplus)._M_p[(int)uVar10];
    bVar9 = isNumberChar((uint)bVar3);
    if (bVar9) {
      bVar14 = bVar14 | iVar13 == 1;
      bVar12 = bVar12 | iVar13 == 1;
      uVar10 = (ulong)(this->pos + 1);
      bVar7 = false;
      goto LAB_001047da;
    }
    if (bVar7) goto LAB_00104969;
    if ((bool)(~bVar14 & 1 | (bVar3 & 0xffffffdf) != 0x45)) {
      if (bVar12 != 0xff || bVar3 != 0x2e) goto LAB_00104875;
      uVar11 = this->pos + 1;
      goto LAB_00104917;
    }
    iVar6 = this->pos;
    uVar10 = (long)iVar6 + 1;
    this->pos = (int)uVar10;
    if (((int)uVar10 < this->length) &&
       ((cVar4 = (psVar1->_M_dataplus)._M_p[uVar10], cVar4 == '+' || (cVar4 == '-')))) break;
    bVar7 = true;
    bVar14 = 0;
    bVar12 = 0;
  } while( true );
  uVar11 = iVar6 + 2;
  bVar14 = 0;
LAB_00104917:
  uVar10 = (ulong)uVar11;
  bVar7 = true;
  bVar12 = 0;
  goto LAB_001047da;
}

Assistant:

Token Parser::readNumberToken() {
        int chunkStart = pos;
        int count = 0;
        bool allowDot = false;
        bool allowE = false;
        bool expectNumber = true;
        int code = getCodeAt(pos);

        if (code == 45) { // '-'
            pos++;
        }

        while (isValidPos()) {
            code = getCodeAt(pos);
            count++;

            if (isNumberChar(code)) {
                if (count == 1) {
                    allowDot = true;
                    allowE = true;
                }
                expectNumber = false;
                pos++;
            } else if (expectNumber) {
                break;
            } else if (allowE && (code == 69 || code == 101)) { // 'E' or 'e'
                allowE = false;
                allowDot = false;
                expectNumber = true;
                pos++;
                if (isValidPos() && (getCodeAt(pos) == 43 || getCodeAt(pos) == 45)) { // '+' or '-'
                    pos++;
                }
            } else if (allowDot && code == 46) { // '.'
                allowDot = false;
                expectNumber = true;
                pos++;
            } else {
                break;
            }
        }

        // check
        if (expectNumber) {
            unexpected(TYPE_NUMBER, pos);
        }

        string value = input.substr(chunkStart, pos - chunkStart);
        return Token(NUMBER, value, chunkStart, pos);
    }